

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

void __thiscall Minisat::IntOption::giveRndValue(IntOption *this,string *optionText)

{
  int iVar1;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  ostringstream strs;
  int rndV;
  ostringstream *this_00;
  string local_220 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  char *in_stack_fffffffffffffe18;
  string local_1e0 [32];
  string local_1c0 [48];
  ostringstream local_190 [380];
  int local_14;
  string *local_10;
  
  local_14 = *(int *)(in_RDI + 0x30);
  local_10 = in_RSI;
  iVar1 = rand();
  for (local_14 = iVar1 + local_14; *(int *)(in_RDI + 0x34) < local_14;
      local_14 = local_14 - (*(int *)(in_RDI + 0x34) - *(int *)(in_RDI + 0x30))) {
  }
  this_00 = local_190;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::ostream::operator<<(this_00,local_14);
  std::operator+(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  std::operator+(in_RDI,(char *)this_00);
  std::__cxx11::ostringstream::str();
  std::operator+(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  std::__cxx11::string::operator=(local_10,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string(local_220);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe00);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void giveRndValue(std::string &optionText)
    {
        int rndV = range.begin;
        rndV += rand();
        while (rndV > range.end) {
            rndV -= range.end - range.begin;
        }
        std::ostringstream strs;
        strs << rndV;
        optionText = "-" + optionText + "=" + strs.str();
    }